

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_log.h
# Opt level: O0

double brotli::FastLog2(size_t v)

{
  undefined1 auVar1 [16];
  size_t v_local;
  
  if (v < 0x100) {
    v_local = (size_t)(double)*(float *)(kLog2Table + v * 4);
  }
  else {
    auVar1._8_4_ = (int)(v >> 0x20);
    auVar1._0_8_ = v;
    auVar1._12_4_ = 0x45300000;
    v_local = (size_t)log2((auVar1._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)v) - 4503599627370496.0));
  }
  return (double)v_local;
}

Assistant:

static inline double FastLog2(size_t v) {
  if (v < sizeof(kLog2Table) / sizeof(kLog2Table[0])) {
    return kLog2Table[v];
  }
#if defined(_MSC_VER) && _MSC_VER <= 1600
  // Visual Studio 2010 does not have the log2() function defined, so we use
  // log() and a multiplication instead.
  static const double kLog2Inv = 1.4426950408889634f;
  return log(static_cast<double>(v)) * kLog2Inv;
#else
  return log2(static_cast<double>(v));
#endif
}